

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deep.cpp
# Opt level: O1

void anon_unknown.dwarf_44b36::generateRandomTileFile
               (string *filename,int channelCount,Compression compression)

{
  PixelType PVar1;
  int iVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  ushort uVar5;
  ushort uVar6;
  char cVar7;
  int *piVar8;
  Array2D<void_*> *pAVar9;
  result_type rVar10;
  result_type rVar11;
  int iVar12;
  uint uVar13;
  ostream *poVar14;
  long *plVar15;
  string *psVar16;
  ulong uVar17;
  void *pvVar18;
  void *pvVar19;
  ulong uVar20;
  ulong uVar21;
  ulong *puVar22;
  void *pvVar23;
  uint uVar24;
  uint32_t ui;
  float fVar25;
  int iVar26;
  PixelType PVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  ushort uVar31;
  ushort uVar32;
  int iVar33;
  ushort uVar34;
  ulong uVar35;
  long lVar36;
  int j_1;
  long lVar37;
  float fVar38;
  long local_300;
  int j;
  Array<Imf_3_4::Array2D<void_*>_> data;
  DeepTiledOutputFile file;
  int i;
  imath_half_bits_t ret;
  int type;
  int iStack_284;
  long local_278 [2];
  default_random_engine generator;
  Box2i box;
  DeepFrameBuffer frameBuffer;
  stringstream ss;
  int iStack_1b4;
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"  generating deep tiled file \'",0x1e);
  poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,(filename->_M_dataplus)._M_p,filename->_M_string_length
                      );
  std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\' compression ",0xe);
  plVar15 = (long *)std::ostream::operator<<(poVar14,compression);
  std::ios::widen((char)*(undefined8 *)(*plVar15 + -0x18) + (char)plVar15);
  std::ostream::put((char)plVar15);
  std::ostream::flush();
  frameBuffer._map._M_t._M_impl._0_8_ = 0;
  Imf_3_4::Header::Header
            ((Header *)&ss,(Box *)(anonymous_namespace)::displayWindow,
             (Box *)&(anonymous_namespace)::dataWindow,1.0,(Vec2 *)&frameBuffer,1.0,INCREASING_Y,
             compression);
  Imf_3_4::Header::operator=((Header *)(anonymous_namespace)::header,(Header *)&ss);
  Imf_3_4::Header::~Header((Header *)&ss);
  generator._M_x = 1;
  if (DAT_00364a18._M_current != (anonymous_namespace)::channelTypes) {
    DAT_00364a18._M_current = (anonymous_namespace)::channelTypes;
  }
  if (0 < channelCount) {
    iVar26 = 0;
    do {
      _ss = 0x200000000;
      rVar10 = std::uniform_int_distribution<int>::operator()
                         ((uniform_int_distribution<int> *)&ss,&generator,(param_type *)&ss);
      type = rVar10;
      std::__cxx11::stringstream::stringstream((stringstream *)&ss);
      std::ostream::operator<<(local_1a8,iVar26);
      std::__cxx11::stringbuf::str();
      if (type == 0) {
        psVar16 = (string *)Imf_3_4::Header::channels();
        Imf_3_4::Channel::Channel((Channel *)&box,UINT,1,1,false);
        Imf_3_4::ChannelList::insert(psVar16,(Channel *)&frameBuffer);
      }
      if (type == 1) {
        psVar16 = (string *)Imf_3_4::Header::channels();
        Imf_3_4::Channel::Channel((Channel *)&box,HALF,1,1,false);
        Imf_3_4::ChannelList::insert(psVar16,(Channel *)&frameBuffer);
      }
      if (type == 2) {
        psVar16 = (string *)Imf_3_4::Header::channels();
        Imf_3_4::Channel::Channel((Channel *)&box,FLOAT,1,1,false);
        Imf_3_4::ChannelList::insert(psVar16,(Channel *)&frameBuffer);
      }
      if (DAT_00364a18._M_current == DAT_00364a20) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&(anonymous_namespace)::channelTypes,
                   DAT_00364a18,&type);
      }
      else {
        *DAT_00364a18._M_current = type;
        DAT_00364a18._M_current = DAT_00364a18._M_current + 1;
      }
      if ((_Base_ptr *)frameBuffer._map._M_t._M_impl._0_8_ !=
          &frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
        operator_delete((void *)frameBuffer._map._M_t._M_impl._0_8_,
                        (ulong)((long)&(frameBuffer._map._M_t._M_impl.super__Rb_tree_header.
                                        _M_header._M_parent)->_M_color + 1));
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
      std::ios_base::~ios_base(local_138);
      iVar26 = iVar26 + 1;
    } while (channelCount != iVar26);
  }
  Imf_3_4::Header::setType((string *)(anonymous_namespace)::header);
  _ss = 0x11000000000;
  rVar10 = std::uniform_int_distribution<int>::operator()
                     ((uniform_int_distribution<int> *)&ss,&generator,(param_type *)&ss);
  _ss = 0xa800000000;
  rVar11 = std::uniform_int_distribution<int>::operator()
                     ((uniform_int_distribution<int> *)&ss,&generator,(param_type *)&ss);
  _ss = CONCAT44(rVar11 + 1,rVar10 + 1);
  Imf_3_4::Header::setTileDescription((TileDescription *)(anonymous_namespace)::header);
  remove((filename->_M_dataplus)._M_p);
  Imf_3_4::DeepTiledOutputFile::DeepTiledOutputFile
            (&file,(filename->_M_dataplus)._M_p,(Header *)(anonymous_namespace)::header,8);
  frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header;
  frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  Imf_3_4::Slice::Slice(&frameBuffer._sampleCounts,HALF,(char *)0x0,0,0,1,1,0.0,false,false);
  Imf_3_4::Array<Imf_3_4::Array2D<void_*>_>::Array(&data,(long)channelCount);
  uVar17 = (ulong)(uint)channelCount;
  if (0 < channelCount) {
    lVar37 = 0;
    do {
      pAVar9 = data._data;
      pvVar18 = operator_new__(0x5a1c8);
      pvVar19 = *(void **)((long)&pAVar9->_data + lVar37);
      if (pvVar19 != (void *)0x0) {
        operator_delete__(pvVar19);
      }
      *(undefined8 *)((long)&pAVar9->_sizeX + lVar37) = 0xa9;
      *(undefined8 *)((long)&pAVar9->_sizeY + lVar37) = 0x111;
      *(void **)((long)&pAVar9->_data + lVar37) = pvVar18;
      lVar37 = lVar37 + 0x18;
    } while (uVar17 * 0x18 != lVar37);
  }
  pvVar19 = operator_new__(0x2d0e4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"   tileSizeX ",0xd);
  Imf_3_4::DeepTiledOutputFile::tileXSize();
  poVar14 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar14,"   tileSizeY ",0xd);
  Imf_3_4::DeepTiledOutputFile::tileYSize();
  poVar14 = std::ostream::_M_insert<unsigned_long>((ulong)poVar14);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
  std::ostream::put((char)poVar14);
  std::ostream::flush();
  iVar26 = Imf_3_4::DeepTiledOutputFile::numYLevels();
  iVar12 = Imf_3_4::DeepTiledOutputFile::numXLevels();
  lVar37 = (long)iVar26;
  lVar28 = (long)iVar12;
  uVar35 = lVar28 * lVar37;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = uVar35;
  uVar20 = SUB168(auVar4 * ZEXT816(0x18),0);
  uVar21 = uVar20 + 8;
  if (0xfffffffffffffff7 < uVar20) {
    uVar21 = 0xffffffffffffffff;
  }
  uVar20 = 0xffffffffffffffff;
  if (SUB168(auVar4 * ZEXT816(0x18),8) == 0) {
    uVar20 = uVar21;
  }
  puVar22 = (ulong *)operator_new__(uVar20);
  *puVar22 = uVar35;
  puVar22 = puVar22 + 1;
  if (uVar35 != 0) {
    memset(puVar22,0,((uVar35 * 0x18 - 0x18) / 0x18) * 0x18 + 0x18);
  }
  if (DAT_00364a50 != (ulong *)0x0) {
    lVar36 = *(long *)((long)DAT_00364a50 + -8);
    pvVar18 = (void *)((long)DAT_00364a50 + -8);
    if (lVar36 != 0) {
      lVar29 = lVar36 * 0x18;
      do {
        pvVar23 = *(void **)((long)pvVar18 + lVar29);
        if (pvVar23 != (void *)0x0) {
          operator_delete__(pvVar23);
        }
        lVar29 = lVar29 + -0x18;
      } while (lVar29 != 0);
    }
    operator_delete__(pvVar18,lVar36 * 0x18 + 8);
  }
  (anonymous_namespace)::sampleCountTiles = lVar37;
  DAT_00364a48 = lVar28;
  DAT_00364a50 = puVar22;
  if (0 < iVar26) {
    lVar28 = 0;
    lVar37 = 0;
    do {
      if (0 < DAT_00364a48) {
        lVar36 = 0x10;
        lVar29 = 0;
        do {
          puVar22 = DAT_00364a50;
          lVar30 = DAT_00364a48;
          pvVar23 = operator_new__(0x2d0e4);
          lVar30 = lVar30 * lVar28;
          pvVar18 = *(void **)((long)puVar22 + lVar36 + lVar30);
          if (pvVar18 != (void *)0x0) {
            operator_delete__(pvVar18);
          }
          *(undefined8 *)((long)puVar22 + lVar36 + lVar30 + -0x10) = 0xa9;
          *(undefined8 *)((long)puVar22 + lVar36 + -8 + lVar30) = 0x111;
          *(void **)((long)puVar22 + lVar36 + lVar30) = pvVar23;
          lVar29 = lVar29 + 1;
          lVar36 = lVar36 + 0x18;
        } while (lVar29 < DAT_00364a48);
      }
      lVar37 = lVar37 + 1;
      lVar28 = lVar28 + 0x18;
    } while (lVar37 < (anonymous_namespace)::sampleCountTiles);
  }
  lVar37 = (long)DAT_003649f4 * 0x111 + (long)(anonymous_namespace)::dataWindow;
  Imf_3_4::Slice::Slice
            ((Slice *)&ss,UINT,(char *)((long)pvVar19 + lVar37 * -4),4,0x444,1,1,0.0,false,false);
  Imf_3_4::DeepFrameBuffer::insertSampleCountSlice((Slice *)&frameBuffer);
  if (0 < channelCount) {
    lVar28 = 0x10;
    uVar20 = 0;
    do {
      PVar1 = (anonymous_namespace)::channelTypes[uVar20];
      PVar27 = (uint)(PVar1 != UINT) * 3;
      if (PVar1 == HALF) {
        PVar27 = PVar1;
      }
      if (PVar1 == FLOAT) {
        PVar27 = PVar1;
      }
      std::__cxx11::stringstream::stringstream((stringstream *)&ss);
      std::ostream::operator<<(local_1a8,(int)uVar20);
      std::__cxx11::stringbuf::str();
      iVar26 = (anonymous_namespace)::channelTypes[uVar20];
      uVar21 = (ulong)(iVar26 == 0) << 2;
      if (iVar26 == 1) {
        uVar21 = 2;
      }
      if (iVar26 == 2) {
        uVar21 = 4;
      }
      Imf_3_4::DeepSlice::DeepSlice
                ((DeepSlice *)&box,PVar27,
                 (char *)(*(long *)((long)&(data._data)->_sizeX + lVar28) + lVar37 * -8),8,0x888,
                 uVar21,1,1,0.0,false,false);
      Imf_3_4::DeepFrameBuffer::insert((string *)&frameBuffer,(DeepSlice *)&type);
      if (_type != (param_type)local_278) {
        operator_delete((void *)_type,local_278[0] + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
      std::ios_base::~ios_base(local_138);
      uVar20 = uVar20 + 1;
      lVar28 = lVar28 + 0x18;
    } while (uVar17 != uVar20);
  }
  Imf_3_4::DeepTiledOutputFile::setFrameBuffer((DeepFrameBuffer *)&file);
  local_300 = 0;
  while( true ) {
    iVar26 = Imf_3_4::DeepTiledOutputFile::numYLevels();
    if (iVar26 <= local_300) break;
    lVar37 = 0;
    while( true ) {
      iVar26 = Imf_3_4::DeepTiledOutputFile::numXLevels();
      if (iVar26 <= lVar37) break;
      Imf_3_4::DeepTiledOutputFile::dataWindowForLevel((int)&ss,(int)&file);
      j = 0;
      while( true ) {
        iVar12 = (int)&file;
        iVar26 = Imf_3_4::DeepTiledOutputFile::numYTiles(iVar12);
        if (iVar26 <= j) break;
        i = 0;
        while( true ) {
          iVar26 = Imf_3_4::DeepTiledOutputFile::numXTiles((int)&file);
          if (iVar26 <= i) break;
          Imf_3_4::DeepTiledOutputFile::dataWindowForTile((int)&box,(int)&file,i,j);
          iVar26 = box.min.y;
          if (box.min.y <= box.max.y) {
            do {
              iVar12 = box.min.x;
              if (box.min.x <= box.max.x) {
                do {
                  lVar36 = (long)iStack_1b4;
                  lVar28 = (long)_ss;
                  type = 0;
                  iStack_284 = 9;
                  rVar10 = std::uniform_int_distribution<int>::operator()
                                     ((uniform_int_distribution<int> *)&type,&generator,
                                      (param_type *)&type);
                  lVar36 = iVar26 - lVar36;
                  lVar28 = iVar12 - lVar28;
                  *(result_type *)((long)pvVar19 + lVar28 * 4 + lVar36 * 0x444) = rVar10 + 1;
                  *(result_type *)
                   (DAT_00364a50[DAT_00364a48 * local_300 * 3 + lVar37 * 3 + 1] * lVar36 * 4 +
                    DAT_00364a50[DAT_00364a48 * local_300 * 3 + lVar37 * 3 + 2] + lVar28 * 4) =
                       rVar10 + 1;
                  if (0 < channelCount) {
                    iVar33 = ((int)lVar36 * 0x111 + (int)lVar28) % 0x801;
                    fVar38 = (float)iVar33;
                    fVar25 = ABS(fVar38);
                    uVar24 = (uint)fVar38 & 0x7fffff | 0x800000;
                    cVar7 = (char)((uint)fVar38 >> 0x17);
                    uVar34 = (ushort)((uint)fVar38 >> 0x10) & 0x8000;
                    uVar13 = (uint)fVar38 >> 0xd & 0x3ff;
                    uVar5 = uVar34 + 0x7c00;
                    if ((uint)fVar25 < 0x477ff000) {
                      uVar5 = (ushort)((int)fVar25 + 0x8000fff +
                                       (uint)(((uint)fVar25 >> 0xd & 1) != 0) >> 0xd) | uVar34;
                    }
                    uVar6 = (ushort)(uVar13 == 0) | (ushort)uVar13;
                    if (fVar25 == INFINITY) {
                      uVar6 = 0;
                    }
                    uVar20 = 0;
                    do {
                      if ((anonymous_namespace)::channelTypes[uVar20] == 0) {
                        pvVar18 = operator_new__((ulong)*(uint *)((long)pvVar19 +
                                                                 lVar28 * 4 + lVar36 * 0x444) << 2);
                        data._data[uVar20]._data[data._data[uVar20]._sizeY * lVar36 + lVar28] =
                             pvVar18;
                      }
                      if ((anonymous_namespace)::channelTypes[uVar20] == 1) {
                        pvVar18 = operator_new__((ulong)*(uint *)((long)pvVar19 +
                                                                 lVar28 * 4 + lVar36 * 0x444) * 2);
                        data._data[uVar20]._data[data._data[uVar20]._sizeY * lVar36 + lVar28] =
                             pvVar18;
                      }
                      if ((anonymous_namespace)::channelTypes[uVar20] == 2) {
                        pvVar18 = operator_new__((ulong)*(uint *)((long)pvVar19 +
                                                                 lVar28 * 4 + lVar36 * 0x444) << 2);
                        data._data[uVar20]._data[data._data[uVar20]._sizeY * lVar36 + lVar28] =
                             pvVar18;
                      }
                      piVar8 = (anonymous_namespace)::channelTypes;
                      if (*(int *)((long)pvVar19 + lVar28 * 4 + lVar36 * 0x444) != 0) {
                        uVar21 = 0;
                        do {
                          if (piVar8[uVar20] == 0) {
                            *(int *)((long)data._data[uVar20]._data
                                           [data._data[uVar20]._sizeY * lVar36 + lVar28] +
                                    uVar21 * 4) = iVar33;
                          }
                          iVar2 = piVar8[uVar20];
                          if (iVar2 == 2) {
                            *(float *)((long)data._data[uVar20]._data
                                             [data._data[uVar20]._sizeY * lVar36 + lVar28] +
                                      uVar21 * 4) = fVar38;
                          }
                          else if (iVar2 == 1) {
                            uVar31 = uVar5;
                            if (0x7f7fffff < (uint)fVar25) {
                              uVar31 = uVar34 + uVar6 + 0x7c00;
                            }
                            uVar32 = (ushort)(0x80000000 < uVar24 << (cVar7 + 0xa2U & 0x1f)) +
                                     ((ushort)(uVar24 >> (0x7eU - cVar7 & 0x1f)) | uVar34);
                            if ((uint)fVar25 < 0x33000001) {
                              uVar32 = uVar34;
                            }
                            if (0x387fffff < (uint)fVar25) {
                              uVar32 = uVar31;
                            }
                            *(ushort *)
                             ((long)data._data[uVar20]._data
                                    [data._data[uVar20]._sizeY * lVar36 + lVar28] + uVar21 * 2) =
                                 uVar32;
                          }
                          uVar21 = uVar21 + 1;
                        } while (uVar21 < *(uint *)((long)pvVar19 + lVar28 * 4 + lVar36 * 0x444));
                      }
                      uVar20 = uVar20 + 1;
                    } while (uVar20 != uVar17);
                  }
                  bVar3 = iVar12 < box.max.x;
                  iVar12 = iVar12 + 1;
                } while (bVar3);
              }
              bVar3 = iVar26 < box.max.y;
              iVar26 = iVar26 + 1;
            } while (bVar3);
          }
          i = i + 1;
        }
        j = j + 1;
      }
      iVar26 = Imf_3_4::DeepTiledOutputFile::numXTiles(iVar12);
      iVar33 = Imf_3_4::DeepTiledOutputFile::numYTiles(iVar12);
      Imf_3_4::DeepTiledOutputFile::writeTiles(iVar12,0,iVar26 + -1,0,iVar33 + -1,(int)lVar37);
      lVar28 = 0;
      while( true ) {
        iVar26 = Imf_3_4::DeepTiledOutputFile::levelHeight((int)&file);
        if (iVar26 <= lVar28) break;
        lVar36 = 0;
        while( true ) {
          iVar26 = Imf_3_4::DeepTiledOutputFile::levelWidth((int)&file);
          if (iVar26 <= lVar36) break;
          if (0 < channelCount) {
            lVar29 = 4;
            uVar20 = 0;
            do {
              if (((anonymous_namespace)::channelTypes[uVar20] == 0) &&
                 (pvVar18 = *(void **)(*(long *)((long)data._data + lVar29 * 4 + -8) * lVar28 * 8 +
                                       *(long *)((long)&(data._data)->_sizeX + lVar29 * 4) +
                                      lVar36 * 8), pvVar18 != (void *)0x0)) {
                operator_delete__(pvVar18);
              }
              if (((anonymous_namespace)::channelTypes[uVar20] == 1) &&
                 (pvVar18 = *(void **)(*(long *)((long)data._data + lVar29 * 4 + -8) * lVar28 * 8 +
                                       *(long *)((long)&(data._data)->_sizeX + lVar29 * 4) +
                                      lVar36 * 8), pvVar18 != (void *)0x0)) {
                operator_delete__(pvVar18);
              }
              if (((anonymous_namespace)::channelTypes[uVar20] == 2) &&
                 (pvVar18 = *(void **)(*(long *)((long)data._data + lVar29 * 4 + -8) * lVar28 * 8 +
                                       *(long *)((long)&(data._data)->_sizeX + lVar29 * 4) +
                                      lVar36 * 8), pvVar18 != (void *)0x0)) {
                operator_delete__(pvVar18);
              }
              uVar20 = uVar20 + 1;
              lVar29 = lVar29 + 6;
            } while (uVar17 != uVar20);
          }
          lVar36 = lVar36 + 1;
        }
        lVar28 = lVar28 + 1;
      }
      lVar37 = lVar37 + 1;
    }
    local_300 = local_300 + 1;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"   --> done",0xb);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
  std::ostream::put(-0x28);
  std::ostream::flush();
  operator_delete__(pvVar19);
  Imf_3_4::Array<Imf_3_4::Array2D<void_*>_>::~Array(&data);
  std::
  _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>_>_>
  ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>_>_>
               *)&frameBuffer);
  Imf_3_4::DeepTiledOutputFile::~DeepTiledOutputFile(&file);
  return;
}

Assistant:

void
generateRandomTileFile (
    const std::string& filename, int channelCount, Compression compression)
{
    std::cout << "  generating deep tiled file '" << filename
              << "' compression " << compression << std::endl;
    header = Header (
        displayWindow,
        dataWindow,
        1,
        IMATH_NAMESPACE::V2f (0, 0),
        1,
        INCREASING_Y,
        compression);

    constexpr bool             relativeCoords = false;
    std::default_random_engine generator;
    auto                       generate_random_int = [&] (int range) -> int {
        std::uniform_int_distribution<int> distribution (0, range - 1);
        return distribution (generator);
    };
    //
    // Add channels.
    //

    channelTypes.clear ();

    for (int i = 0; i < channelCount; i++)
    {
        int               type = generate_random_int (3);
        std::stringstream ss;
        ss << i;
        std::string str = ss.str ();
        if (type == 0) header.channels ().insert (str, Channel (IMF::UINT));
        if (type == 1) header.channels ().insert (str, Channel (IMF::HALF));
        if (type == 2) header.channels ().insert (str, Channel (IMF::FLOAT));
        channelTypes.push_back (type);
    }

    header.setType (DEEPTILE);
    header.setTileDescription (TileDescription (
        generate_random_int (width) + 1,
        generate_random_int (height) + 1,
        RIPMAP_LEVELS));

    //
    // Set up the output file
    //
    remove (filename.c_str ());
    DeepTiledOutputFile file (filename.c_str (), header, 8);

    DeepFrameBuffer frameBuffer;

    Array<Array2D<void*>> data (channelCount);
    for (int i = 0; i < channelCount; i++)
        data[i].resizeErase (height, width);

    Array2D<unsigned int> sampleCount;
    sampleCount.resizeErase (height, width);

    std::cout << "   tileSizeX " << file.tileXSize () << "   tileSizeY "
              << file.tileYSize () << std::endl;

    sampleCountTiles.resizeErase (file.numYLevels (), file.numXLevels ());
    for (int i = 0; i < sampleCountTiles.height (); i++)
        for (int j = 0; j < sampleCountTiles.width (); j++)
            sampleCountTiles[i][j].resizeErase (height, width);

    int memOffset;
    if (relativeCoords)
        memOffset = 0;
    else
        memOffset = dataWindow.min.x + dataWindow.min.y * width;

    frameBuffer.insertSampleCountSlice (Slice (
        IMF::UINT,
        (char*) (&sampleCount[0][0] - memOffset),
        sizeof (unsigned int) * 1,
        sizeof (unsigned int) * width,
        1,
        1,
        0,
        relativeCoords,
        relativeCoords));

    for (int i = 0; i < channelCount; i++)
    {
        PixelType type = NUM_PIXELTYPES;
        if (channelTypes[i] == 0) type = IMF::UINT;
        if (channelTypes[i] == 1) type = IMF::HALF;
        if (channelTypes[i] == 2) type = IMF::FLOAT;

        std::stringstream ss;
        ss << i;
        std::string str = ss.str ();

        int sampleSize = 0;
        if (channelTypes[i] == 0) sampleSize = sizeof (unsigned int);
        if (channelTypes[i] == 1) sampleSize = sizeof (half);
        if (channelTypes[i] == 2) sampleSize = sizeof (float);

        int pointerSize = sizeof (char*);

        frameBuffer.insert (
            str,
            DeepSlice (
                type,
                (char*) (&data[i][0][0] - memOffset),
                pointerSize * 1,
                pointerSize * width,
                sampleSize,
                1,
                1,
                0,
                relativeCoords,
                relativeCoords));
    }

    file.setFrameBuffer (frameBuffer);

    for (int ly = 0; ly < file.numYLevels (); ly++)
        for (int lx = 0; lx < file.numXLevels (); lx++)
        {
            Box2i dataWindowL = file.dataWindowForLevel (lx, ly);

            for (int j = 0; j < file.numYTiles (ly); j++)
            {
                for (int i = 0; i < file.numXTiles (lx); i++)
                {
                    Box2i box = file.dataWindowForTile (i, j, lx, ly);
                    for (int y = box.min.y; y <= box.max.y; y++)
                        for (int x = box.min.x; x <= box.max.x; x++)
                        {
                            int dwy = y - dataWindowL.min.y;
                            int dwx = x - dataWindowL.min.x;
                            sampleCount[dwy][dwx] =
                                generate_random_int (10) + 1;
                            sampleCountTiles[ly][lx][dwy][dwx] =
                                sampleCount[dwy][dwx];
                            for (int k = 0; k < channelCount; k++)
                            {
                                if (channelTypes[k] == 0)
                                    data[k][dwy][dwx] =
                                        new unsigned int[sampleCount[dwy][dwx]];
                                if (channelTypes[k] == 1)
                                    data[k][dwy][dwx] =
                                        new half[sampleCount[dwy][dwx]];
                                if (channelTypes[k] == 2)
                                    data[k][dwy][dwx] =
                                        new float[sampleCount[dwy][dwx]];
                                for (unsigned int l = 0;
                                     l < sampleCount[dwy][dwx];
                                     l++)
                                {
                                    if (channelTypes[k] == 0)
                                        ((unsigned int*) data[k][dwy][dwx])[l] =
                                            (dwy * width + dwx) % 2049;
                                    if (channelTypes[k] == 1)
                                        ((half*) data[k][dwy][dwx])[l] =
                                            (dwy * width + dwx) % 2049;
                                    if (channelTypes[k] == 2)
                                        ((float*) data[k][dwy][dwx])[l] =
                                            (dwy * width + dwx) % 2049;
                                }
                            }
                        }
                }
            }

            file.writeTiles (
                0, file.numXTiles (lx) - 1, 0, file.numYTiles (ly) - 1, lx, ly);

            for (int i = 0; i < file.levelHeight (ly); i++)
                for (int j = 0; j < file.levelWidth (lx); j++)
                    for (int k = 0; k < channelCount; k++)
                    {
                        if (channelTypes[k] == 0)
                            delete[] (unsigned int*) data[k][i][j];
                        if (channelTypes[k] == 1)
                            delete[] (half*) data[k][i][j];
                        if (channelTypes[k] == 2)
                            delete[] (float*) data[k][i][j];
                    }
        }
    std::cout << "   --> done" << std::endl;
}